

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_decode_from_hex_odd_Test::TestBody
          (HexEncoderTest_test_decode_from_hex_odd_Test *this)

{
  internal iVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertHelper local_e0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  long local_c8;
  internal local_c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  long *local_30 [2];
  long local_20 [2];
  
  local_e0.data_._0_1_ = 0;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"0","");
  bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_d8,local_30);
  if (local_d0 == local_d8.ptr_) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00197b4c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00197b5e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  }
  else {
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              (local_c0,"(unsigned char) 0","HexEncoder::DecodeFromHex(\"0\").at(0)",
               (uchar *)&local_e0,(uchar *)local_d8.ptr_);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_d8.ptr_,local_c8 - (long)local_d8.ptr_);
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    iVar1 = local_c0[0];
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      if (local_b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_b8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x37,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (((local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 == (internal)0x0) {
      return;
    }
    local_e0.data_._0_1_ = 1;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"17f","");
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_d8,local_50);
    if (local_d0 == local_d8.ptr_) goto LAB_00197b4c;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              (local_c0,"(unsigned char) 1","HexEncoder::DecodeFromHex(\"17f\").at(0)",
               (uchar *)&local_e0,(uchar *)local_d8.ptr_);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_d8.ptr_,local_c8 - (long)local_d8.ptr_);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar1 = local_c0[0];
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      if (local_b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_b8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x38,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (((local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 == (internal)0x0) {
      return;
    }
    local_e0.data_._0_1_ = 0x7f;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"17f","");
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_d8,local_70);
    if ((ulong)((long)local_d0 - (long)local_d8.ptr_) < 2) goto LAB_00197b5e;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              (local_c0,"(unsigned char) 127","HexEncoder::DecodeFromHex(\"17f\").at(1)",
               (uchar *)&local_e0,(uchar *)(local_d8.ptr_ + 1));
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_d8.ptr_,local_c8 - (long)local_d8.ptr_);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    iVar1 = local_c0[0];
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      if (local_b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_b8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x39,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (((local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 == (internal)0x0) {
      return;
    }
    local_e0.data_._0_1_ = 2;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"280","");
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_d8,local_90);
    if (local_d0 != local_d8.ptr_) {
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                (local_c0,"(unsigned char) 2","HexEncoder::DecodeFromHex(\"280\").at(0)",
                 (uchar *)&local_e0,(uchar *)local_d8.ptr_);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_d8.ptr_,local_c8 - (long)local_d8.ptr_);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      iVar1 = local_c0[0];
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d8);
        if (local_b8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x3a,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        if (((local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (iVar1 == (internal)0x0) {
        return;
      }
      local_e0.data_._0_1_ = 0x80;
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"280","");
      bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_d8,local_b0);
      if (1 < (ulong)((long)local_d0 - (long)local_d8.ptr_)) {
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  (local_c0,"(unsigned char) -128","HexEncoder::DecodeFromHex(\"280\").at(1)",
                   (uchar *)&local_e0,(uchar *)(local_d8.ptr_ + 1));
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(local_d8.ptr_,local_c8 - (long)local_d8.ptr_);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          if (local_b8.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_b8.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x3b,pcVar4);
          testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_e0);
          if (((local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      goto LAB_00197b83;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00197b83:
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  __clang_call_terminate(uVar3);
}

Assistant:

TEST(HexEncoderTest, test_decode_from_hex_odd)
{
    ASSERT_EQ((unsigned char) 0, HexEncoder::DecodeFromHex("0").at(0));
    ASSERT_EQ((unsigned char) 1, HexEncoder::DecodeFromHex("17f").at(0));
    ASSERT_EQ((unsigned char) 127, HexEncoder::DecodeFromHex("17f").at(1));
    ASSERT_EQ((unsigned char) 2, HexEncoder::DecodeFromHex("280").at(0));
    ASSERT_EQ((unsigned char) -128, HexEncoder::DecodeFromHex("280").at(1));
}